

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mojoshader_compiler.c
# Opt level: O1

MOJOSHADER_astDataType * datatype_base(Context_conflict *ctx,MOJOSHADER_astDataType *dt)

{
  MOJOSHADER_astDataType *pMVar1;
  
  pMVar1 = reduce_datatype(ctx,dt);
  if (pMVar1 == (MOJOSHADER_astDataType *)0x0) {
    pMVar1 = (MOJOSHADER_astDataType *)0x0;
  }
  else if (pMVar1->type - MOJOSHADER_AST_DATATYPE_ARRAY < 4) {
    pMVar1 = (pMVar1->array).base;
  }
  return pMVar1;
}

Assistant:

static const MOJOSHADER_astDataType *datatype_base(Context *ctx, const MOJOSHADER_astDataType *dt)
{
    dt = reduce_datatype(ctx, dt);
    if (dt == NULL)
        return dt;

    switch (dt->type)
    {
        case MOJOSHADER_AST_DATATYPE_VECTOR:
            dt = dt->vector.base;
            break;
        case MOJOSHADER_AST_DATATYPE_MATRIX:
            dt = dt->matrix.base;
            break;
        case MOJOSHADER_AST_DATATYPE_BUFFER:
            dt = dt->buffer.base;
            break;
        case MOJOSHADER_AST_DATATYPE_ARRAY:
            dt = dt->array.base;
            break;
        default: break;
    } // switch

    return dt;
}